

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::anon_unknown_31::PrintBytesInObjectToImpl(uchar *obj_bytes,size_t count,ostream *os)

{
  ostream *poVar1;
  ostream *in_RDX;
  uchar *in_RSI;
  size_t resume_pos;
  size_t kChunkSize;
  size_t kThreshold;
  size_t count_00;
  
  poVar1 = (ostream *)std::ostream::operator<<(in_RDX,(ulong)in_RSI);
  std::operator<<(poVar1,"-byte object <");
  count_00 = 0x84;
  poVar1 = (ostream *)0x40;
  if (in_RSI < (uchar *)0x84) {
    PrintByteSegmentInObjectTo(in_RSI,(size_t)in_RDX,0x84,(ostream *)0x40);
  }
  else {
    PrintByteSegmentInObjectTo(in_RSI,(size_t)in_RDX,0x84,(ostream *)0x40);
    std::operator<<(in_RDX," ... ");
    PrintByteSegmentInObjectTo(in_RSI,(size_t)in_RDX,count_00,poVar1);
  }
  std::operator<<(in_RDX,">");
  return;
}

Assistant:

void PrintBytesInObjectToImpl(const unsigned char* obj_bytes, size_t count,
                              ostream* os) {
  // Tells the user how big the object is.
  *os << count << "-byte object <";

  const size_t kThreshold = 132;
  const size_t kChunkSize = 64;
  // If the object size is bigger than kThreshold, we'll have to omit
  // some details by printing only the first and the last kChunkSize
  // bytes.
  if (count < kThreshold) {
    PrintByteSegmentInObjectTo(obj_bytes, 0, count, os);
  } else {
    PrintByteSegmentInObjectTo(obj_bytes, 0, kChunkSize, os);
    *os << " ... ";
    // Rounds up to 2-byte boundary.
    const size_t resume_pos = (count - kChunkSize + 1) / 2 * 2;
    PrintByteSegmentInObjectTo(obj_bytes, resume_pos, count - resume_pos, os);
  }
  *os << ">";
}